

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataControllerDefault.cpp
# Opt level: O0

bool __thiscall
Rml::DataControllerValue::Initialize
          (DataControllerValue *this,DataModel *model,Element *element,String *variable_name,
          String *param_4)

{
  code *pcVar1;
  bool bVar2;
  DataVariable local_68;
  undefined4 local_54;
  undefined1 local_50 [8];
  DataAddress variable_address;
  String *param_4_local;
  String *variable_name_local;
  Element *element_local;
  DataModel *model_local;
  DataControllerValue *this_local;
  
  variable_address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)param_4;
  if ((element == (Element *)0x0) &&
     (bVar2 = Assert("RMLUI_ASSERT(element)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataControllerDefault.cpp"
                     ,0x30), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  DataModel::ResolveAddress((DataAddress *)local_50,model,variable_name,element);
  bVar2 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::empty
                    ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)
                     local_50);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    local_68 = DataModel::GetVariable(model,(DataAddress *)local_50);
    bVar2 = DataVariable::operator_cast_to_bool(&local_68);
    if (bVar2) {
      ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::operator=
                (&this->address,
                 (vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)local_50);
    }
    Element::AddEventListener(element,Change,&this->super_EventListener,false);
    this_local._7_1_ = true;
  }
  local_54 = 1;
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector
            ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)local_50);
  return this_local._7_1_;
}

Assistant:

bool DataControllerValue::Initialize(DataModel& model, Element* element, const String& variable_name, const String& /*modifier*/)
{
	RMLUI_ASSERT(element);

	DataAddress variable_address = model.ResolveAddress(variable_name, element);
	if (variable_address.empty())
		return false;

	if (model.GetVariable(variable_address))
		address = std::move(variable_address);

	element->AddEventListener(EventId::Change, this);

	return true;
}